

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

void timer_cb_file(uv_timer_t *handle)

{
  if (timer_cb_called != 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file2");
    uv_close(handle,close_cb);
    return;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file1");
  return;
}

Assistant:

static void timer_cb_file(uv_timer_t* handle) {
  ++timer_cb_called;

  if (timer_cb_called == 1) {
    touch_file("watch_dir/file1");
  } else {
    touch_file("watch_dir/file2");
    uv_close((uv_handle_t*)handle, close_cb);
  }
}